

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool CombinationKeyTest<Blob<128>,unsigned_long>
               (hashfunc<Blob<128>_> hash,int maxlen,unsigned_long *blocks,int blockcount,
               bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  unsigned_long *key;
  undefined4 in_register_00000034;
  ulong uVar2;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  
  printf("Keyset \'Combination\' - up to %d blocks from a set of %d - ",
         CONCAT44(in_register_00000034,maxlen),(ulong)(uint)blockcount);
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < maxlen) {
    uVar2 = (ulong)(uint)maxlen << 3;
  }
  key = (unsigned_long *)operator_new__(uVar2);
  CombinationKeygenRecurse<Blob<128>,unsigned_long>
            (key,0,maxlen,blocks,blockcount,hash.m_hash,&hashes);
  operator_delete__(key);
  printf("%d keys\n",
         (ulong)((long)hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 4);
  bVar1 = TestHashList<Blob<128>>(&hashes,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  std::_Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>);
  return bVar1;
}

Assistant:

bool CombinationKeyTest ( hashfunc<hashtype> hash, int maxlen, blocktype* blocks,
                          int blockcount, bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Combination' - up to %d blocks from a set of %d - ",maxlen,blockcount);

  //----------

  std::vector<hashtype> hashes;

  blocktype * key = new blocktype[maxlen];

  CombinationKeygenRecurse(key,0,maxlen,blocks,blockcount,hash,hashes);

  delete [] key;

  printf("%d keys\n",(int)hashes.size());

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}